

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_object.c
# Opt level: O0

ssize_t tnt_object_add_bin(tnt_stream *s,void *bin,uint32_t len)

{
  long *plVar1;
  long lVar2;
  ssize_t sVar3;
  char *end;
  undefined1 auStack_4c [2];
  char data [6];
  int v_sz;
  iovec v [2];
  tnt_sbuf_object *sbo;
  uint32_t len_local;
  void *bin_local;
  tnt_stream *s_local;
  
  plVar1 = *(long **)((long)s->data + 0x30);
  if ((char)plVar1[1] != '\0') {
    lVar2 = *plVar1 + (long)(int)(*(byte *)(plVar1 + 1) - 1) * 0x10;
    *(int *)(lVar2 + 8) = *(int *)(lVar2 + 8) + 1;
  }
  _auStack_4c = 2;
  mp_encode_binl((char *)((long)&end + 6),len);
  unique0x00004780 = (long)&end + 6;
  sVar3 = (*s->writev)(s,(iovec *)(data + 2),_auStack_4c);
  return sVar3;
}

Assistant:

ssize_t
tnt_object_add_bin (struct tnt_stream *s, const void *bin, uint32_t len)
{
	struct tnt_sbuf_object *sbo = TNT_SOBJ_CAST(s);
	if (sbo->stack_size > 0)
		sbo->stack[sbo->stack_size - 1].size += 1;
	struct iovec v[2]; int v_sz = 2;
	char data[6], *end;
	end = mp_encode_binl(data, len);
	v[0].iov_base = data;
	v[0].iov_len  = end - data;
	v[1].iov_base = (void *)bin;
	v[1].iov_len  = len;
	return s->writev(s, v, v_sz);
}